

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O0

void check_secfrac_convert(void)

{
  float f;
  uint64_t secfracs;
  size_t i;
  char teststr_s2f [30];
  char teststr_f2s [30];
  anon_struct_16_2_01c60da5 testvals [4];
  char *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ulong secfracs_00;
  undefined4 in_stack_ffffffffffffffb4;
  undefined2 uVar1;
  float secfracsf;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_10;
  
  uVar1 = (undefined2)((uint)in_stack_ffffffffffffffb4 >> 0x10);
  memset(local_48,0,0x40);
  local_38 = 0x3efae148;
  local_30 = 0x7d70a400;
  local_28 = 0x3f000000;
  local_20 = 0x80000000;
  local_18 = 0x3f7fff58;
  local_10 = 0xffff5800;
  secfracsf = (float)CONCAT22(uVar1,0x73);
  for (secfracs_00 = 0; secfracs_00 < 4; secfracs_00 = secfracs_00 + 1) {
    rtosc_float2secfracs(secfracsf);
    assert_true((int)in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,0);
    in_stack_ffffffffffffff64 = rtosc_secfracs2float(secfracs_00);
    assert_f32_eq(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  }
  return;
}

Assistant:

void check_secfrac_convert()
{
    struct
    {
        float    f;
        uint64_t secfracs;
    } testvals[] = { { 0.f,   0 },          /* 0 secfracs is always 0 */
                     { 0.49f, 2104534016},  /* 0.49 ~ max(signed int) */
                     { 0.5f,  2147483648},
                     { 0.99999f, 4294924288} };      /* 0.99 ~ max(unsigned int) */

    char teststr_f2s[] = "testvals 0, float -> secfracs";
    char teststr_s2f[] = "testvals 0, secfracs -> float";
    for(size_t i = 0; i < sizeof(testvals)/sizeof(testvals[0]); ++i)
    {
        teststr_f2s[9]++;
        teststr_s2f[9]++;
        uint64_t secfracs = rtosc_float2secfracs(testvals[i].f);
        assert_true(testvals[i].secfracs == secfracs, teststr_f2s, __LINE__);
        float f = rtosc_secfracs2float(testvals[i].secfracs);
        assert_f32_eq(testvals[i].f, f, teststr_s2f, __LINE__);
    }
}